

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

void __thiscall WorldShuffler::open_random_blocked_path(WorldShuffler *this)

{
  Item *item_00;
  bool bVar1;
  reference pvVar2;
  reference ppWVar3;
  WorldNode *pWVar4;
  string *psVar5;
  reference ppIVar6;
  mapped_type_conflict2 *pmVar7;
  ItemSource *pIVar8;
  initializer_list_t init;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_120;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> local_110;
  ItemSource *local_f8;
  ItemSource *source;
  Item *local_e8;
  Item *item;
  iterator __end1;
  iterator __begin1;
  vector<Item_*,_std::allocator<Item_*>_> *__range1;
  vector<Item_*,_std::allocator<Item_*>_> items_to_place;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  WorldPath *local_70;
  WorldPath *path_to_open;
  undefined1 local_60 [8];
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> weighted_blocked_paths;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_38;
  json_ref<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_28;
  Json *debug_log;
  WorldShuffler *this_local;
  
  debug_log = (Json *)this;
  local_28.value_ref = WorldSolver::debug_log_for_current_step_abi_cxx11_(&this->_solver);
  std::
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::initializer_list(&local_38);
  init._M_len = (size_type)local_38._M_array;
  init._M_array = &local_28;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::array(init);
  pvVar2 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)local_28.value_ref,"blockedPaths");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar2,&local_28.owned_value);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_28.owned_value);
  build_weighted_blocked_paths_list
            ((vector<WorldPath_*,_std::allocator<WorldPath_*>_> *)local_60,this);
  bVar1 = std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::empty
                    ((vector<WorldPath_*,_std::allocator<WorldPath_*>_> *)local_60);
  if (bVar1) {
    path_to_open._4_4_ = 1;
  }
  else {
    ppWVar3 = std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::operator[]
                        ((vector<WorldPath_*,_std::allocator<WorldPath_*>_> *)local_60,0);
    local_70 = *ppWVar3;
    pvVar2 = nlohmann::
             basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)local_28.value_ref,"chosenPath");
    pWVar4 = WorldPath::origin(local_70);
    psVar5 = WorldNode::id_abi_cxx11_(pWVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &items_to_place.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,psVar5," --> ");
    pWVar4 = WorldPath::destination(local_70);
    psVar5 = WorldNode::id_abi_cxx11_(pWVar4);
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &items_to_place.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,psVar5);
    nlohmann::
    basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::emplace_back<std::__cxx11::string>
              ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)pvVar2,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string
              ((string *)
               &items_to_place.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    WorldSolver::missing_items_to_take_path
              ((vector<Item_*,_std::allocator<Item_*>_> *)&__range1,&this->_solver,local_70);
    __end1 = std::vector<Item_*,_std::allocator<Item_*>_>::begin
                       ((vector<Item_*,_std::allocator<Item_*>_> *)&__range1);
    item = (Item *)std::vector<Item_*,_std::allocator<Item_*>_>::end
                             ((vector<Item_*,_std::allocator<Item_*>_> *)&__range1);
    while( true ) {
      bVar1 = __gnu_cxx::operator==<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                        (&__end1,(__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                                  *)&item);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppIVar6 = __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                ::operator*(&__end1);
      local_e8 = *ppIVar6;
      while( true ) {
        source._7_1_ = Item::id(local_e8);
        pmVar7 = std::
                 map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                 ::operator[](&this->_item_pool_quantities,(key_type_conflict *)((long)&source + 7))
        ;
        item_00 = local_e8;
        if (*pmVar7 == 0) break;
        WorldSolver::empty_reachable_item_sources(&local_110,&this->_solver);
        pIVar8 = place_item_randomly(this,item_00,&local_110);
        std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::~vector(&local_110);
        local_f8 = pIVar8;
        std::vector<ItemSource*,std::allocator<ItemSource*>>::emplace_back<ItemSource*&>
                  ((vector<ItemSource*,std::allocator<ItemSource*>> *)&this->_logical_playthrough,
                   &local_f8);
        psVar5 = Item::name_abi_cxx11_(local_e8);
        nlohmann::
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_120,psVar5);
        pvVar2 = nlohmann::
                 basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)local_28.value_ref,"placedKeyItems");
        psVar5 = ItemSource::name_abi_cxx11_(local_f8);
        pvVar2 = nlohmann::
                 basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator[](pvVar2,psVar5);
        nlohmann::
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator=(pvVar2,&local_120);
        nlohmann::
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_120);
      }
      __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
      operator++(&__end1);
    }
    std::vector<Item_*,_std::allocator<Item_*>_>::~vector
              ((vector<Item_*,_std::allocator<Item_*>_> *)&__range1);
    path_to_open._4_4_ = 0;
  }
  std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::~vector
            ((vector<WorldPath_*,_std::allocator<WorldPath_*>_> *)local_60);
  return;
}

Assistant:

void WorldShuffler::open_random_blocked_path()
{
    Json& debug_log = _solver.debug_log_for_current_step();
    debug_log["blockedPaths"] = Json::array();

    // List all blocked paths, taking weights into account and randomly choose one
    std::vector<WorldPath*> weighted_blocked_paths = this->build_weighted_blocked_paths_list();
    if (weighted_blocked_paths.empty())
        return;
    WorldPath* path_to_open = weighted_blocked_paths[0];
    debug_log["chosenPath"].emplace_back(path_to_open->origin()->id() + " --> " + path_to_open->destination()->id());

    // Place all missing key items for the player to be able to open this blocking path
    std::vector<Item*> items_to_place = _solver.missing_items_to_take_path(path_to_open);
    for(Item* item : items_to_place)
    {
        while(_item_pool_quantities[item->id()] > 0)
        {
            ItemSource* source = this->place_item_randomly(item, _solver.empty_reachable_item_sources());
            _logical_playthrough.emplace_back(source);
            debug_log["placedKeyItems"][source->name()] = item->name();
        }
    }
}